

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::compute_division
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *axis,
          vec<16U,_float> *centroid,weighted_vec_array *vecs,vector<unsigned_int> *indices,
          vector<unsigned_int> *left_indices,vector<unsigned_int> *right_indices)

{
  float fVar1;
  float *pfVar2;
  weighted_vec *lhs;
  float fVar3;
  undefined1 local_80 [4];
  float t;
  vec<16U,_float> v;
  uint vec_index;
  uint i;
  vector<unsigned_int> *left_indices_local;
  vector<unsigned_int> *indices_local;
  weighted_vec_array *vecs_local;
  vec<16U,_float> *centroid_local;
  vec<16U,_float> *axis_local;
  threaded_clusterizer<crnlib::vec<16U,_float>_> *this_local;
  
  vector<unsigned_int>::resize(left_indices,0,false);
  vector<unsigned_int>::resize(right_indices,0,false);
  v.m_s[0xf] = 0.0;
  while( true ) {
    fVar3 = v.m_s[0xf];
    fVar1 = (float)vector<unsigned_int>::size(indices);
    if ((uint)fVar1 <= (uint)fVar3) break;
    pfVar2 = (float *)vector<unsigned_int>::operator[](indices,(uint)v.m_s[0xf]);
    v.m_s[0xe] = *pfVar2;
    lhs = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::operator[]
                    (vecs,(uint)v.m_s[0xe]);
    crnlib::operator-((vec<16U,_float> *)local_80,&lhs->m_vec,centroid);
    fVar3 = crnlib::operator*((vec<16U,_float> *)local_80,axis);
    if (0.0 <= fVar3) {
      vector<unsigned_int>::push_back(right_indices,(uint *)(v.m_s + 0xe));
    }
    else {
      vector<unsigned_int>::push_back(left_indices,(uint *)(v.m_s + 0xe));
    }
    v.m_s[0xf] = (float)((int)v.m_s[0xf] + 1);
  }
  return;
}

Assistant:

void compute_division(
            const VectorType& axis, const VectorType& centroid, const weighted_vec_array& vecs, const vector<uint>& indices,
            vector<uint>& left_indices,
            vector<uint>& right_indices)
        {
            left_indices.resize(0);
            right_indices.resize(0);

            for (uint i = 0; i < indices.size(); i++)
            {
                const uint vec_index = indices[i];
                const VectorType v(vecs[vec_index].m_vec - centroid);

                float t = v * axis;
                if (t < 0.0f)
                {
                    left_indices.push_back(vec_index);
                }
                else
                {
                    right_indices.push_back(vec_index);
                }
            }
        }